

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O1

string * gflags::XMLText(string *__return_storage_ptr__,string *txt)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (txt->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + txt->_M_string_length);
  uVar3 = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x12c258,uVar3);
    if (uVar2 == 0xffffffffffffffff) break;
    uVar3 = uVar2 + 1;
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,(char *)0x1,0x12c25a);
  }
  uVar3 = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x12c260,uVar3);
    if (uVar2 == 0xffffffffffffffff) break;
    uVar3 = uVar2 + 1;
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,(char *)0x1,0x12c262);
  }
  return __return_storage_ptr__;
}

Assistant:

static string XMLText(const string& txt) {
  string ans = txt;
  for (string::size_type pos = 0; (pos = ans.find("&", pos)) != string::npos; )
    ans.replace(pos++, 1, "&amp;");
  for (string::size_type pos = 0; (pos = ans.find("<", pos)) != string::npos; )
    ans.replace(pos++, 1, "&lt;");
  return ans;
}